

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::Pin<kj::(anonymous_namespace)::Obj>::~Pin(Pin<kj::(anonymous_namespace)::Obj> *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pcVar1 = (this->t).name.content.ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->t).name.content.size_;
    pAVar3 = (this->t).name.content.disposer;
    (this->t).name.content.ptr = (char *)0x0;
    (this->t).name.content.size_ = 0;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Pin() {
    // Destroy a Pin with underlying object.
    // Undefined behavior when live pointers exist, asserted when KJ_ASSERT_PTR_COUNTERS is defined.
#if KJ_ASSERT_PTR_COUNTERS
    ptrCounter.assertEmpty();
#endif
  }